

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TypeEntry::~TypeEntry(TypeEntry *this)

{
  TypeEntry *this_local;
  
  ~TypeEntry(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~TypeEntry() = default;